

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::verify
          (FilterCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int severity_;
  MessageData *pMVar1;
  size_t this_00;
  bool bVar2;
  int extraout_EAX;
  MessageData *pMVar3;
  MessageBuilder *pMVar4;
  pointer ppVar5;
  pointer ppVar6;
  Enum<int,_2UL> EVar7;
  MessageBuilder local_758;
  undefined1 local_5d8 [8];
  VerificationResult result;
  string local_588;
  MessageData local_568;
  undefined1 local_535;
  int local_534;
  int iStack_530;
  bool enabled;
  int resCount;
  int refCount;
  GLenum severity;
  MessageID *id;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>
  local_518;
  iterator local_510;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>
  local_508;
  const_iterator itr;
  string local_4f8;
  GetNameFunc local_4d8;
  int local_4d0;
  Enum<int,_2UL> local_4c8;
  GetNameFunc local_4b8;
  int local_4b0;
  Enum<int,_2UL> local_4a8;
  MessageBuilder local_498;
  mapped_type *local_318;
  MessageMeta *meta_1;
  MessageData *msg_1;
  size_t resNdx;
  string local_2f8;
  GetNameFunc local_2d8;
  int local_2d0;
  Enum<int,_2UL> local_2c8;
  GetNameFunc local_2b8;
  int local_2b0;
  Enum<int,_2UL> local_2a8;
  MessageBuilder local_298;
  mapped_type *local_118;
  MessageMeta *meta;
  MessageData *msg;
  size_t refNdx;
  string local_f8;
  allocator<char> local_c1;
  string local_c0;
  LogSection local_a0;
  undefined1 local_60 [8];
  map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
  counts;
  TestLog *log;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *filters_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  *resMessages_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  *refMessages_local;
  FilterCase *this_local;
  
  counts._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)tcu::TestContext::getLog
                         ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
  ::map((map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
         *)local_60);
  this_00 = counts._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"verification",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Verifying",(allocator<char> *)((long)&refNdx + 7));
  tcu::LogSection::LogSection(&local_a0,&local_c0,&local_f8);
  tcu::TestLog::operator<<((TestLog *)this_00,&local_a0);
  tcu::LogSection::~LogSection(&local_a0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&refNdx + 7));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  msg = (MessageData *)0x0;
  while( true ) {
    pMVar1 = msg;
    pMVar3 = (MessageData *)
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                     *)ctx);
    if (pMVar3 <= pMVar1) break;
    meta = (MessageMeta *)
           std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
           ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                         *)ctx,(size_type)msg);
    local_118 = std::
                map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
                ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
                              *)local_60,(key_type *)meta);
    if ((local_118->severity != 0) && (local_118->severity != meta[1].refCount)) {
      tcu::TestLog::operator<<
                (&local_298,(TestLog *)counts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_298,
                          (char (*) [53])"A message has variable severity between instances: (");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(MessageID *)meta);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])") with severity ");
      EVar7 = glu::getDebugMessageSeverityStr(local_118->severity);
      local_2b8 = EVar7.m_getName;
      local_2b0 = EVar7.m_value;
      local_2a8.m_getName = local_2b8;
      local_2a8.m_value = local_2b0;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2a8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [6])0x2b74730);
      EVar7 = glu::getDebugMessageSeverityStr(meta[1].refCount);
      local_2d8 = EVar7.m_getName;
      local_2d0 = EVar7.m_value;
      local_2c8.m_getName = local_2d8;
      local_2c8.m_value = local_2d0;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2c8);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_298);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,
                 "Message severity changed between instances of the same message",
                 (allocator<char> *)((long)&resNdx + 7));
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&resNdx + 7));
    }
    local_118->refCount = local_118->refCount + 1;
    local_118->severity = meta[1].refCount;
    msg = (MessageData *)((long)&(msg->id).source + 1);
  }
  msg_1 = (MessageData *)0x0;
  while( true ) {
    pMVar1 = msg_1;
    pMVar3 = (MessageData *)
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                     *)sig);
    if (pMVar3 <= pMVar1) break;
    meta_1 = (MessageMeta *)
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                           *)sig,(size_type)msg_1);
    local_318 = std::
                map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
                ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
                              *)local_60,(key_type *)meta_1);
    if ((local_318->severity != 0) && (local_318->severity != meta_1[1].refCount)) {
      tcu::TestLog::operator<<
                (&local_498,(TestLog *)counts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_498,
                          (char (*) [53])"A message has variable severity between instances: (");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(MessageID *)meta_1);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])") with severity ");
      EVar7 = glu::getDebugMessageSeverityStr(local_318->severity);
      local_4b8 = EVar7.m_getName;
      local_4b0 = EVar7.m_value;
      local_4a8.m_getName = local_4b8;
      local_4a8.m_value = local_4b0;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_4a8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [6])0x2b74730);
      EVar7 = glu::getDebugMessageSeverityStr(meta_1[1].refCount);
      local_4d8 = EVar7.m_getName;
      local_4d0 = EVar7.m_value;
      local_4c8.m_getName = local_4d8;
      local_4c8.m_value = local_4d0;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_4c8);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_498);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,
                 "Message severity changed between instances of the same message",
                 (allocator<char> *)((long)&itr._M_node + 7));
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,&local_4f8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&itr._M_node + 7));
    }
    local_318->resCount = local_318->resCount + 1;
    local_318->severity = meta_1[1].refCount;
    msg_1 = (MessageData *)((long)&(msg_1->id).source + 1);
  }
  local_510._M_node =
       (_Base_ptr)
       std::
       map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
       ::begin((map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
                *)local_60);
  std::
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>
  ::_Rb_tree_const_iterator(&local_508,&local_510);
  while( true ) {
    id = (MessageID *)
         std::
         map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
         ::end((map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
                *)local_60);
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>
    ::_Rb_tree_const_iterator(&local_518,(iterator *)&id);
    bVar2 = std::operator!=(&local_508,&local_518);
    if (!bVar2) break;
    _refCount = std::
                _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>
                ::operator->(&local_508);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>
             ::operator->(&local_508);
    resCount = (ppVar5->second).severity;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>
             ::operator->(&local_508);
    iStack_530 = (ppVar5->second).refCount;
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>
             ::operator->(&local_508);
    ppVar5 = _refCount;
    severity_ = resCount;
    local_534 = (ppVar6->second).resCount;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,"",
               (allocator<char> *)(result.logMessage.field_2._M_local_buf + 0xf));
    MessageData::MessageData(&local_568,&ppVar5->first,severity_,&local_588);
    bVar2 = isEnabled(this,(vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                            *)siglen,&local_568);
    MessageData::~MessageData(&local_568);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator
              ((allocator<char> *)(result.logMessage.field_2._M_local_buf + 0xf));
    local_535 = bVar2;
    BaseCase::verifyMessageCount
              ((VerificationResult *)local_5d8,&this->super_BaseCase,&_refCount->first,resCount,
               iStack_530,local_534,bVar2);
    tcu::TestLog::operator<<
              (&local_758,(TestLog *)counts._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_758,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&result.resultMessage.field_2 + 8));
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_758);
    if (local_5d8._0_4_ != QP_TEST_RESULT_PASS) {
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,local_5d8._0_4_,(string *)&result);
    }
    BaseCase::VerificationResult::~VerificationResult((VerificationResult *)local_5d8);
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>
    ::operator++(&local_508,0);
  }
  tcu::TestLog::operator<<
            ((TestLog *)counts._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (EndSectionToken *)&tcu::TestLog::EndSection);
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
  ::~map((map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
          *)local_60);
  return extraout_EAX;
}

Assistant:

void FilterCase::verify (const vector<MessageData>& refMessages, const vector<MessageData>& resMessages, const vector<MessageFilter>& filters)
{
	TestLog&						log		= m_testCtx.getLog();
	map<MessageID, MessageMeta>		counts;

	log << TestLog::Section("verification", "Verifying");

	// Gather message counts & severities, report severity mismatches if found
	for (size_t refNdx = 0; refNdx < refMessages.size(); refNdx++)
	{
		const MessageData&	msg  = refMessages[refNdx];
		MessageMeta&		meta = counts[msg.id];

		if (meta.severity != GL_NONE && meta.severity != msg.severity)
		{
			log << TestLog::Message << "A message has variable severity between instances: (" << msg.id << ") with severity "
				<< glu::getDebugMessageSeverityStr(meta.severity) << " and " << glu::getDebugMessageSeverityStr(msg.severity) << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_FAIL, "Message severity changed between instances of the same message");
		}

		meta.refCount++;
		meta.severity = msg.severity;
	}

	for (size_t resNdx = 0; resNdx < resMessages.size(); resNdx++)
	{
		const MessageData&	msg  = resMessages[resNdx];
		MessageMeta&		meta = counts[msg.id];

		if (meta.severity != GL_NONE && meta.severity != msg.severity)
		{
			log << TestLog::Message << "A message has variable severity between instances: (" << msg.id << ") with severity "
				<< glu::getDebugMessageSeverityStr(meta.severity) << " and " << glu::getDebugMessageSeverityStr(msg.severity) << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_FAIL, "Message severity changed between instances of the same message");
		}

		meta.resCount++;
		meta.severity = msg.severity;
	}

	for (map<MessageID, MessageMeta>::const_iterator itr = counts.begin(); itr != counts.end(); itr++)
	{
		const MessageID&	id			= itr->first;
		const GLenum		severity	= itr->second.severity;

		const int			refCount	= itr->second.refCount;
		const int			resCount	= itr->second.resCount;
		const bool			enabled		= isEnabled(filters, MessageData(id, severity, ""));

		VerificationResult	result		= verifyMessageCount(id, severity, refCount, resCount, enabled);

		log << TestLog::Message << result.logMessage << TestLog::EndMessage;

		if (result.result != QP_TEST_RESULT_PASS)
			m_results.addResult(result.result, result.resultMessage);
	}

	log << TestLog::EndSection;
}